

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RewardModelMappingSparseMapped.h
# Opt level: O0

void __thiscall
RewardModelMappingSparseMapped::Set
          (RewardModelMappingSparseMapped *this,Index s_i,Index ja_i,double rew)

{
  const_reference pvVar1;
  ulong in_XMM0_Qa;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double *in_stack_ffffffffffffff68;
  sparse_matrix_element<boost::numeric::ublas::mapped_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
  *in_stack_ffffffffffffff70;
  mapped_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
  *in_stack_ffffffffffffff78;
  size_type in_stack_ffffffffffffffa0;
  size_type in_stack_ffffffffffffffa8;
  mapped_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
  *in_stack_ffffffffffffffb0;
  
  auVar3._8_8_ = 0;
  auVar3._0_8_ = in_XMM0_Qa;
  auVar5._8_8_ = 0x7fffffffffffffff;
  auVar5._0_8_ = 0x7fffffffffffffff;
  auVar3 = vpand_avx(auVar3,auVar5);
  if (auVar3._0_8_ <= 1e-12) {
    boost::numeric::ublas::
    mapped_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
    ::operator()((mapped_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
                  *)&stack0xffffffffffffff98,(size_type)in_stack_ffffffffffffff70,
                 (size_type)in_stack_ffffffffffffff68);
    pvVar1 = boost::numeric::ublas::sparse_matrix_element::operator_cast_to_double_
                       (in_stack_ffffffffffffff70);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *pvVar1;
    auVar6._8_8_ = 0x7fffffffffffffff;
    auVar6._0_8_ = 0x7fffffffffffffff;
    auVar3 = vpand_avx(auVar4,auVar6);
    dVar2 = auVar3._0_8_;
    boost::numeric::ublas::
    sparse_matrix_element<boost::numeric::ublas::mapped_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
    ::~sparse_matrix_element
              ((sparse_matrix_element<boost::numeric::ublas::mapped_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
                *)0xaa1da2);
    if (1e-12 < dVar2) {
      boost::numeric::ublas::
      mapped_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
      ::erase_element(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0)
      ;
    }
  }
  else {
    boost::numeric::ublas::
    mapped_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
    ::operator()(in_stack_ffffffffffffff78,(size_type)in_stack_ffffffffffffff70,
                 (size_type)in_stack_ffffffffffffff68);
    boost::numeric::ublas::
    sparse_matrix_element<boost::numeric::ublas::mapped_matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::map_std<unsigned_long,double,std::allocator<std::pair<unsigned_long_const,double>>>>>
    ::operator=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    boost::numeric::ublas::
    sparse_matrix_element<boost::numeric::ublas::mapped_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
    ::~sparse_matrix_element
              ((sparse_matrix_element<boost::numeric::ublas::mapped_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
                *)0xaa1d1f);
  }
  return;
}

Assistant:

void Set(Index s_i, Index ja_i, double rew)
        {
            // make sure reward is not 0
            if(fabs(rew) > REWARD_PRECISION)
                _m_R(s_i,ja_i)=rew;
            // check if we already defined this element, if so remove it
            else if(fabs(_m_R(s_i,ja_i))>REWARD_PRECISION)
                _m_R.erase_element(s_i,ja_i);

        }